

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test::
AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
          (AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
           *this)

{
  AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
  *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test_00884560
  ;
  return;
}

Assistant:

TEST(AbstractTransaction, AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  ByteData bytedata;
  // AddScriptWitnessStack
  EXPECT_THROW(tx.AddScriptWitnessStack(3, bytedata), CfdException);

  ByteData bytedata2(
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, bytedata2));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");

  // SetScriptWitnessStack
  EXPECT_THROW(tx.SetScriptWitnessStack(3, 0, bytedata), CfdException);
  EXPECT_THROW(tx.SetScriptWitnessStack(3, 3, bytedata), CfdException);
  EXPECT_NO_THROW(tx.SetScriptWitnessStack(0, 0, ByteData("82780763")));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "82780763");
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 1);

  // RemoveScriptWitnessStackAll
  EXPECT_THROW(tx.RemoveScriptWitnessStackAll(3), CfdException);
  EXPECT_NO_THROW(tx.RemoveScriptWitnessStackAll(0));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
}